

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O3

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_containedIn(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  int iVar1;
  iterator __position;
  node_pointer ppVar2;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar3;
  ulong uVar4;
  pointer pvVar5;
  node_pointer ppVar6;
  undefined1 *puVar7;
  pointer *__ptr;
  long lVar8;
  unsigned_long *k;
  undefined4 in_register_00000034;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong in_R8;
  ulong uVar12;
  long lVar13;
  emplace_return eVar14;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  active_variations;
  int local_6c;
  ulong local_68;
  table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
  local_60;
  
  lVar8 = CONCAT44(in_register_00000034,chromosome_id);
  local_6c = (int)start;
  this->_vptr_VariationIndex = (_func_int **)0x0;
  local_68 = in_R8;
  ppVar2 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
           ::find_node_impl<int,std::equal_to<int>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                       *)(lVar8 + 0x10),(long)local_6c,&local_6c,
                      (equal_to<int> *)((ulong)(*(byte *)(lVar8 + 0x10) & 1) + lVar8 + 0x11));
  if (ppVar2 != (node_pointer)0x0) {
    eVar14 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
             ::try_emplace_unique<int_const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                         *)(lVar8 + 0x10),&local_6c);
    iVar3 = eVar14.first.node_;
    uVar4 = (end - 1) / *(ulong *)(lVar8 + 0x78);
    lVar8 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x20);
    if (uVar4 < (ulong)(*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x28) - lVar8 >>
                       5)) {
      local_60.super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>.current_ =
           0;
      uVar9 = 0x26;
      puVar7 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
      do {
        uVar11 = uVar9 >> 1;
        uVar12 = ~uVar11 + uVar9;
        uVar9 = uVar11;
        if (*(ulong *)((long)puVar7 + uVar11 * 8) < 0xb) {
          puVar7 = (undefined1 *)((ulong *)((long)puVar7 + uVar11 * 8) + 1);
          uVar9 = uVar12;
        }
      } while (0 < (long)uVar9);
      puVar10 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value +
                         0x128);
      if (puVar7 != &DAT_0019a950) {
        puVar10 = (ulong *)puVar7;
      }
      local_60.bucket_count_ = *puVar10;
      local_60.size_ = 0;
      local_60.mlf_ = 1.0;
      local_60.max_load_ = 0;
      local_60.buckets_ = (bucket_pointer)0x0;
      uVar4 = *(ulong *)(lVar8 + uVar4 * 0x20);
      lVar8 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 8);
      if (uVar4 < (ulong)((*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x10) - lVar8
                          >> 3) * -0x5555555555555555)) {
        lVar13 = uVar4 * 0x18 + 8;
        do {
          uVar9 = *(ulong *)(lVar8 + -8 + lVar13);
          if (end <= uVar9) {
            if (local_68 < uVar9) break;
            iVar1 = *(int *)(lVar8 + 8 + lVar13);
            if (iVar1 == 2) {
              k = (unsigned_long *)(lVar8 + lVar13);
              ppVar6 = boost::unordered::detail::
                       table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                       ::find_node_impl<unsigned_long,std::equal_to<unsigned_long>>
                                 ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                                   *)&local_60,*(size_t *)(lVar8 + lVar13),k,
                                  (equal_to<unsigned_long> *)
                                  (local_60.
                                   super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                   .funcs_ +
                                  (local_60.
                                   super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                   .current_ & 1)));
              if (ppVar6 != (node_pointer)0x0) {
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                          this->_vptr_VariationIndex;
                if (this_00 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                  pvVar5 = (pointer)operator_new(0x18);
                  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)this,pvVar5);
                  this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                            this->_vptr_VariationIndex;
                }
LAB_0017959e:
                __position._M_current = *(unsigned_long **)(this_00 + 8);
                if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>(this_00,__position,k);
                }
                else {
                  *__position._M_current = *k;
                  *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
                }
              }
            }
            else if (iVar1 == 1) {
              boost::unordered::detail::
              table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
              ::emplace_unique<unsigned_long_const&>
                        ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                          *)&local_60,(const_key_type *)(lVar8 + lVar13),
                         (const_key_type *)(lVar8 + lVar13));
            }
            else if (iVar1 == 0) {
              this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        this->_vptr_VariationIndex;
              if (this_00 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                pvVar5 = (pointer)operator_new(0x18);
                (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)this,pvVar5);
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                          this->_vptr_VariationIndex;
              }
              k = (unsigned_long *)(lVar8 + uVar4 * 0x18 + 8);
              goto LAB_0017959e;
            }
          }
          uVar4 = uVar4 + 1;
          lVar8 = *(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 8);
          lVar13 = lVar13 + 0x18;
        } while (uVar4 < (ulong)((*(long *)((long)&((iVar3.node_)->value_base_).data_.data_ + 0x10)
                                  - lVar8 >> 3) * -0x5555555555555555));
      }
      boost::unordered::detail::
      table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
      ::delete_buckets(&local_60);
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<vector<size_t> > VariationIndex::_containedIn(int chromosome_id, size_t start, size_t end) {
	unique_ptr<vector<size_t> > result(nullptr);
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return result;
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return result;
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> active_variations;
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position < start) continue;
		if (event.position > end) break;
		switch (event.type) {
		case INSERTION:
			if (result.get() == 0) {
				result = unique_ptr<vector<size_t> >(new vector<size_t>());
			}
			result->push_back(event.variation_index);
			break;
		case DELETION_START:
			active_variations.insert(event.variation_index);
			break;
		case DELETION_END:
			if (active_variations.find(event.variation_index) != active_variations.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
			break;
		default:
			assert(false);
			break;
		}
	}
	return result;
}